

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O1

void change_calls(gen_ctx_t gen_ctx,uint8_t *base)

{
  const_ref_t *pcVar1;
  size_t sVar2;
  MIR_item_t pMVar3;
  size_t sVar4;
  ulong uVar5;
  VARR_call_ref_t *pVVar6;
  size_t sVar7;
  VARR_uint64_t *pVVar8;
  uint8_t *puVar9;
  int iVar10;
  VARR_const_ref_t *pVVar11;
  ulong uVar12;
  call_ref_t *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint8_t *addr;
  uint8_t rel_insn [6];
  uint8_t local_60 [8];
  uint8_t *local_58;
  uint8_t *local_50;
  size_t local_48;
  gen_ctx_t local_40;
  MIR_context_t local_38;
  
  pVVar11 = gen_ctx->target_ctx->const_refs;
  local_58 = base;
  if (pVVar11 != (VARR_const_ref_t *)0x0) {
    local_38 = gen_ctx->ctx;
    uVar16 = 0;
    local_40 = gen_ctx;
    do {
      puVar9 = local_58;
      if (pVVar11->els_num <= uVar16) {
        return;
      }
      pcVar1 = pVVar11->varr;
      if (pcVar1 == (const_ref_t *)0x0) {
LAB_0017627e:
        change_calls_cold_3();
LAB_00176283:
        __assert_fail("base[cr.pc - 2] == 0xff",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0xb88,"void change_calls(gen_ctx_t, uint8_t *)");
      }
      if (pcVar1[uVar16].call_p != 0) {
        sVar2 = pcVar1[uVar16].pc;
        if (local_58[sVar2 - 2] != 0xff) goto LAB_00176283;
        pMVar3 = pcVar1[uVar16].func_item;
        sVar4 = pcVar1[uVar16].next_insn_disp;
        uVar5 = pcVar1[uVar16].const_num;
        if ((local_58[sVar2 - 1] != '\x15') && (local_58[sVar2 - 1] != '%')) {
          __assert_fail("base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0xb89,"void change_calls(gen_ctx_t, uint8_t *)");
        }
        addr = local_58 + (sVar2 - 2);
        if ((pMVar3 != (MIR_item_t)0x0) &&
           (local_50 = local_58 + (sVar2 - 2),
           iVar10 = MIR_get_func_redef_permission_p(gen_ctx->ctx), addr = local_50, iVar10 == 0)) {
          pVVar6 = gen_ctx->target_ctx->call_refs;
          if (pVVar6->varr == (call_ref_t *)0x0) {
            change_calls_cold_1();
            return;
          }
          uVar12 = pVVar6->els_num + 1;
          if (pVVar6->size < uVar12) {
            local_48 = (uVar12 >> 1) + uVar12;
            pcVar13 = (call_ref_t *)realloc(pVVar6->varr,local_48 * 0x10);
            pVVar6->varr = pcVar13;
            pVVar6->size = local_48;
          }
          sVar7 = pVVar6->els_num;
          pcVar13 = pVVar6->varr;
          pVVar6->els_num = sVar7 + 1;
          pcVar13[sVar7].ref_func_item = pMVar3;
          pcVar13[sVar7].call_addr = local_50;
          gen_ctx = local_40;
          addr = local_50;
        }
        pVVar8 = gen_ctx->target_ctx->const_pool;
        if (((pVVar8 == (VARR_uint64_t *)0x0) || (pVVar8->varr == (uint64_t *)0x0)) ||
           (pVVar8->els_num <= uVar5)) {
          change_calls_cold_2();
          goto LAB_0017627e;
        }
        lVar14 = pVVar8->varr[uVar5] - (long)(local_58 + sVar4);
        if ((int)lVar14 == lVar14) {
          local_60[4] = '\0';
          local_60[5] = '\0';
          local_60[0] = '@';
          local_60[1] = 0xe8;
          local_60[2] = '\0';
          local_60[3] = '\0';
          if (puVar9[sVar2 - 1] == '%') {
            local_60[0] = '@';
            local_60[1] = 0xe9;
            local_60[2] = '\0';
            local_60[3] = '\0';
          }
          lVar15 = 2;
          do {
            local_60[lVar15] = (uint8_t)lVar14;
            lVar15 = lVar15 + 1;
            lVar14 = lVar14 >> 8;
          } while (lVar15 != 6);
          _MIR_change_code(local_38,addr,local_60,6);
        }
      }
      uVar16 = uVar16 + 1;
      pVVar11 = gen_ctx->target_ctx->const_refs;
    } while (pVVar11 != (VARR_const_ref_t *)0x0);
  }
  change_calls_cold_4();
  return;
}

Assistant:

static void change_calls (gen_ctx_t gen_ctx, uint8_t *base) {
  MIR_context_t ctx = gen_ctx->ctx;
  /* changing calls to rel32 calls: */
  for (size_t i = 0; i < VARR_LENGTH (const_ref_t, const_refs); i++) {
    const_ref_t cr = VARR_GET (const_ref_t, const_refs, i);
    if (!cr.call_p) continue;
    gen_assert (base[cr.pc - 2] == 0xff);
    gen_assert (base[cr.pc - 1] == 0x15 || base[cr.pc - 1] == 0x25);
    if (cr.func_item != NULL) store_call_ref (gen_ctx, cr.func_item, (uint8_t *) base + cr.pc - 2);
    uint64_t v = VARR_GET (uint64_t, const_pool, cr.const_num);
    int64_t off = (int64_t) v - (int64_t) (base + cr.next_insn_disp);
    if (!int32_p (off)) continue;
    uint8_t rel_insn[] = {0x40, 0xe8, 0, 0, 0, 0};   /* rex call rel32 */
    if (base[cr.pc - 1] == 0x25) rel_insn[1] = 0xe9; /* rex jmp rel32 */
    set_int64 (rel_insn + 2, off, 4);
    _MIR_change_code (ctx, (uint8_t *) base + cr.pc - 2, (uint8_t *) rel_insn, 6);
  }
}